

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O2

_Bool borg_flow_old(wchar_t why)

{
  byte feat;
  short sVar1;
  short sVar2;
  ushort uVar3;
  loc_conflict t;
  chunk_conflict *pcVar4;
  _Bool _Var5;
  uint32_t uVar6;
  long lVar9;
  loc_conflict lVar10;
  wchar_t wVar7;
  wchar_t wVar8;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  loc_conflict lVar14;
  loc lVar15;
  object *poVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  borg_take *pbVar20;
  int iVar21;
  borg_kill *pbVar22;
  borg_grid *pbVar23;
  ulong uVar24;
  uint32_t uVar25;
  uint uVar26;
  keycode_t kVar27;
  uint uVar28;
  wchar_t y2;
  ulong uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  
  uVar25 = 0;
  if (borg.goal.type != why) goto LAB_0020f4ec;
  uVar28 = (uint)borg_data_flow->data[borg.c.y][borg.c.x] * 10 - 5;
  uVar11 = 0xffffffffffffffff;
  for (uVar24 = 0; uVar26 = (uint)uVar11, uVar24 != 8; uVar24 = uVar24 + 1) {
    sVar1 = ddx_ddd[uVar24];
    sVar2 = ddy_ddd[uVar24];
    lVar9 = (long)borg.c.y + (long)sVar2;
    lVar17 = (long)borg.c.x + (long)sVar1;
    uVar32 = (uint)borg_data_flow->data[lVar9][lVar17] * 10;
    if ((((int)uVar32 <= (int)uVar28) && (0xffffff3a < (int)lVar17 - 0xc6U)) &&
       (0xffffffbe < (int)lVar9 - 0x42U)) {
      uVar6 = 0;
      if (uVar28 <= uVar32) {
        uVar6 = uVar25;
      }
      iVar21 = borg.trait[0x69];
      if (iVar21 == 0) {
        uVar25 = uVar6 + 1;
        if (0 < (int)uVar6) {
          uVar6 = Rand_div(uVar25);
          if (uVar6 != 0) {
            uVar11 = uVar11 & 0xffffffff;
            goto LAB_0020edbd;
          }
          iVar21 = borg.trait[0x69];
          uVar11 = uVar11 & 0xffffffff;
          uVar6 = uVar25;
          goto LAB_0020edf5;
        }
      }
      else {
LAB_0020edf5:
        uVar26 = (uint)uVar11;
        uVar25 = uVar6;
        if ((0 < iVar21) && (uVar25 = uVar6 + 1, 0 < (int)uVar6)) goto LAB_0020edbd;
      }
      if ((borg.goal.type == 10) && (sVar1 == 0 || sVar2 == 0)) {
        uVar11 = (ulong)uVar26;
        lVar10 = loc((uint)borg_flow_x[0],(uint)borg_flow_y[0]);
        lVar14.y = borg.c.y;
        lVar14.x = borg.c.x;
        wVar7 = distance(lVar14,lVar10);
        if (wVar7 < L'\x03') goto LAB_0020edbd;
      }
      uVar11 = uVar24 & 0xffffffff;
      uVar28 = uVar32;
    }
LAB_0020edbd:
  }
  if ((int)uVar26 < 0) goto LAB_0020f0a0;
  wVar7 = ddx_ddd[uVar11 & 0xffffffff] + borg.c.x;
  if (breeder_level == true) {
    uVar19 = 0;
    uVar18 = 0;
    iVar21 = 0;
    for (uVar24 = 0xffffffffffffffff; uVar24 != 2; uVar24 = uVar24 + 1) {
      lVar9 = uVar24 + (long)borg.c.x;
      for (uVar29 = 0xffffffffffffffff; uVar29 != 2; uVar29 = uVar29 + 1) {
        if ((int)uVar29 != 0 || (int)uVar24 != 0) {
          if (borg_grids[(long)borg.c.y + uVar29][lVar9].feat == '\x03') {
            if (((borg_grids[(long)borg.c.y + uVar29][lVar9].kill == '\0') &&
                (track_door.num < 0xff)) &&
               ((int)ddy_ddd[uVar11 & 0xffffffff] != (int)uVar29 || wVar7 != (wchar_t)lVar9)) {
              iVar21 = iVar21 + 1;
              uVar19 = uVar29 & 0xffffffff;
              uVar18 = uVar24 & 0xffffffff;
            }
          }
        }
      }
    }
    if (iVar21 != 0) {
      wVar7 = borg_goto_dir(borg.c.y,borg.c.x,(int)uVar19 + borg.c.y,(int)uVar18 + borg.c.x);
      iVar21 = ddx[wVar7] + borg.c.x;
      iVar30 = ddy[wVar7] + borg.c.y;
      borg.goal.g.x = iVar21;
      borg.goal.g.y = iVar30;
      borg_note("# Closing a door");
      borg_keypress(99);
      borg_queue_direction(wVar7 + L'0');
      uVar28 = (uint)track_door.num;
      uVar24 = 0;
      uVar11 = 0;
      if (0 < (int)uVar28) {
        uVar11 = (ulong)uVar28;
      }
      for (; uVar11 != uVar24; uVar24 = uVar24 + 1) {
        if ((track_door.x[uVar24] == iVar21) && (track_door.y[uVar24] == iVar30)) goto LAB_0020f4e9;
      }
      uVar25 = 1;
      if ((-1 < track_door.num) && ((int)uVar11 < (int)track_door.size)) {
        borg_note("# Noting the closing of a door.");
        uVar25 = 1;
        track_door.num = track_door.num + 1;
        track_door.x[uVar28] = iVar21;
        track_door.y[uVar28] = iVar30;
      }
      goto LAB_0020f4ec;
    }
  }
  if (((borg.goal.less == true) && (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) &&
     ((player->opts).opt[0x20] == false)) {
    borg.goal.less = false;
    kVar27 = 0x3c;
LAB_0020f4e4:
    borg_keypress(kVar27);
    goto LAB_0020f4e9;
  }
  y2 = ddy_ddd[uVar11 & 0xffffffff] + borg.c.y;
  wVar8 = borg_goto_dir(borg.c.y,borg.c.x,y2,wVar7);
  pbVar22 = borg_kills;
  if (wVar8 == L'\x05') goto LAB_0020f0a0;
  lVar9 = (long)ddx[wVar8] + (long)borg.c.x;
  borg.goal.g.x = (int)lVar9;
  borg.goal.g.y = (int)((long)ddy[wVar8] + (long)borg.c.y);
  uVar11 = (ulong)borg_grids[(long)ddy[wVar8] + (long)borg.c.y][lVar9].kill;
  if (uVar11 != 0) {
    uVar3 = borg_kills[uVar11].r_idx;
    if ((((uVar3 == 0) || ((int)(z_info->r_max - 1) <= (int)(uint)uVar3)) ||
        ((borg.trait[0x71] != 0 || (borg.trait[0xba] != 0)))) ||
       (((_Var5 = flag_has_dbg(r_info[(uint)uVar3].flags,0xb,1,"r_info[kill->r_idx].flags",
                               "RF_UNIQUE"), _Var5 && (borg.trait[0x69] == 0)) &&
        (borg.trait[0x23] < 5)))) goto LAB_0020f0a0;
    pbVar22 = pbVar22 + uVar11;
    pcVar12 = borg_race_name((uint)pbVar22->r_idx);
    pcVar12 = format("# Walking into a \'%s\' at (%d,%d)",pcVar12,(ulong)(uint)(pbVar22->pos).y,
                     (ulong)(uint)(pbVar22->pos).x);
    borg_note(pcVar12);
    if (my_no_alter == true) {
      borg_keypress(0x3b);
      my_no_alter = false;
    }
    else {
      borg_keypress(0x2b);
    }
LAB_0020f4dd:
    kVar27 = wVar8 + L'0';
    goto LAB_0020f4e4;
  }
  pbVar23 = borg_grids[(long)ddy[wVar8] + (long)borg.c.y] + lVar9;
  uVar11 = (ulong)pbVar23->take;
  if (uVar11 != 0) {
    if (borg_takes[uVar11].kind == (object_kind *)0x0) goto LAB_0020f40d;
    pbVar20 = borg_takes + uVar11;
    pcVar12 = (borg_takes[uVar11].kind)->name;
    pcVar13 = strstr(pcVar12,"chest");
    if ((pcVar13 == (char *)0x0) ||
       (pcVar12 = strstr(pcVar12,"Ruined"), pcVar4 = cave, pcVar12 != (char *)0x0)) {
LAB_0020f2d7:
      if ((pbVar20->orbed == false) && ((uint)(pbVar20->tval + L'\xfffffffe') < 0x14)) {
        lVar14 = loc((uint)pbVar20->x,(uint)pbVar20->y);
        lVar10.y = borg.c.y;
        lVar10.x = borg.c.x;
        wVar7 = distance(lVar14,lVar10);
        if ((wVar7 == L'\x01') && (_Var5 = borg_spell_okay_fail(ORB_OF_DRAINING,L'\x19'), _Var5)) {
          lVar14 = loc((uint)pbVar20->x,(uint)pbVar20->y);
          borg_target(lVar14);
          borg_spell(ORB_OF_DRAINING);
          borg_note("# Orbing an object to check for cursed item.");
          borg_keypress(0x35);
          pbVar20->orbed = true;
          for (lVar9 = 0; pcVar4 = cave, lVar9 != 0x30; lVar9 = lVar9 + 2) {
            lVar17 = (long)*(short *)((long)borg_ddx_ddd + lVar9) + (ulong)pbVar20->x;
            lVar31 = (long)*(short *)((long)borg_ddy_ddd + lVar9) + (ulong)pbVar20->y;
            lVar15 = (loc)loc((int)lVar17,(int)lVar31);
            _Var5 = square_in_bounds_fully(pcVar4,lVar15);
            if ((_Var5) && ((ulong)borg_grids[lVar31][lVar17].take != 0)) {
              borg_takes[borg_grids[lVar31][lVar17].take].orbed = true;
            }
          }
          goto LAB_0020f4e9;
        }
      }
      pcVar12 = format("# Walking onto and deleting a \'%s\' at (%d,%d)",pbVar20->kind->name,
                       (ulong)pbVar20->y,(ulong)pbVar20->x);
      borg_note(pcVar12);
      borg_delete_take((uint)pbVar23->take);
      goto LAB_0020f4dd;
    }
    lVar15 = (loc)loc(wVar7,y2);
    poVar16 = borg_get_top_object((chunk_conflict1 *)pcVar4,lVar15);
    if (poVar16 == (object *)0x0) {
      borg_delete_take((uint)pbVar23->take);
      goto LAB_0020f0a0;
    }
    sVar1 = poVar16->pval;
    if (sVar1 < 2) {
      if ((-1 < sVar1) && (poVar16->known != (object *)0x0)) goto LAB_0020f2d7;
LAB_0020f7a1:
      pcVar12 = format("# Opening a \'%s\' at (%d,%d)",pbVar20->kind->name,(ulong)pbVar20->y,
                       (ulong)pbVar20->x);
      borg_note(pcVar12);
      kVar27 = 0x6f;
    }
    else {
      if (poVar16->known == (object *)0x0) goto LAB_0020f7a1;
      if (borg.trait[0x38] - (int)sVar1 < borg_cfg[0x16]) goto LAB_0020f2d7;
      pcVar12 = format("# Disarming a \'%s\' at (%d,%d)",pbVar20->kind->name,(ulong)pbVar20->y,
                       (ulong)pbVar20->x);
      borg_note(pcVar12);
      kVar27 = 0x44;
    }
    borg_keypress(kVar27);
    borg_queue_direction(wVar8 + L'0');
    goto LAB_0020f4e9;
  }
LAB_0020f40d:
  if (pbVar23->glyph == true) {
    pcVar12 = format("# Walking onto a glyph of warding.");
LAB_0020f421:
    borg_note(pcVar12);
    goto LAB_0020f4dd;
  }
  if ((((borg.trait[0x1a] == 0) || (borg.trait[0x70] != 0)) || (borg.trait[0x72] != 0)) ||
     ((scaryguy_on_level != false || (pbVar23->trap != true)))) {
    feat = pbVar23->feat;
    if (feat != 0x17) {
      if (feat == 0x16) {
LAB_0020f0a0:
        if ((borg.goal.type == 10) &&
           ((borg.c.y == (uint)borg_flow_y[0] && (borg.c.x == (uint)borg_flow_x[0])))) {
          borg_t_antisummon = (wchar_t)borg_t;
        }
      }
      else {
        if (feat == 2) {
          uVar25 = Rand_div(100);
          if (uVar25 != 0) {
            for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
              if (((borg_grids[(long)ddy_ddd[lVar9] + (long)borg.c.y]
                    [(long)ddx_ddd[lVar9] + (long)borg.c.x].kill != '\0') &&
                  (borg.trait[0x23] < 0xf)) && (borg.trait[0x71] == 0)) goto LAB_0020f0a0;
            }
            uVar25 = Rand_div(100);
            if ((uVar25 == 0) || (499 < borg.time_this_panel)) {
              _Var5 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS);
              if ((_Var5) || (_Var5 = borg_activate_item(act_destroy_doors), _Var5)) {
                borg_note("# Disable Traps, Destroy Doors");
                goto LAB_0020f4e9;
              }
              _Var5 = borg_spell(TURN_STONE_TO_MUD);
              if ((((!_Var5) && (_Var5 = borg_spell(SHATTER_STONE), !_Var5)) &&
                  (_Var5 = borg_activate_ring(sv_ring_digging), !_Var5)) &&
                 (_Var5 = borg_activate_item(act_stone_to_mud), !_Var5)) goto LAB_0020f74e;
              borg_note("# Melting a door");
              borg_keypress(wVar8 + L'0');
            }
            else {
LAB_0020f74e:
              if (my_need_alter == true) {
                borg_keypress(0x2b);
                my_need_alter = false;
              }
              else {
                borg_note("# Opening a door");
                borg_keypress(0x6f);
              }
              borg_queue_direction(wVar8 + L'0');
            }
            uVar25 = 1;
            if (track_closed.num != 0) {
              track_closed.num = 0;
            }
            goto LAB_0020f4ec;
          }
          goto LAB_0020f0a0;
        }
        if (6 < (byte)(feat - 0xf)) goto LAB_0020f6d5;
        if (((feat == 0x10) || (borg.goal.type != 4)) && (_Var5 = borg_can_dig(false,feat), _Var5))
        {
          _Var5 = borg_spell(TURN_STONE_TO_MUD);
          if (((_Var5) || (_Var5 = borg_spell(SHATTER_STONE), _Var5)) ||
             ((_Var5 = borg_activate_ring(sv_ring_digging), _Var5 ||
              (_Var5 = borg_activate_item(act_stone_to_mud), _Var5)))) {
            borg_note("# Melting a wall/etc");
          }
          else {
            uVar25 = Rand_div(500);
            if (((int)uVar25 < 6) && (vault_on_level != true)) goto LAB_0020f0a0;
            borg_note("# Digging through wall/etc");
            borg_keypress(0x54);
          }
          borg_keypress(wVar8 + L'0');
          track_vein.num = 0;
          goto LAB_0020f4e9;
        }
      }
      borg.goal.type = 0;
      uVar25 = 0;
      goto LAB_0020f4ec;
    }
    if (borg.trait[0x40] == 0) goto LAB_0020f0a0;
LAB_0020f6d5:
    _Var5 = feat_is_shop((uint)feat);
    if (_Var5) {
      pcVar12 = format("# Entering a \'%d\' shop",(ulong)pbVar23->store);
      goto LAB_0020f421;
    }
    if (my_need_alter == true) {
      borg_keypress(0x2b);
      my_need_alter = false;
    }
    borg_keypress(wVar8 + L'0');
    borg.in_shop = false;
  }
  else {
    _Var5 = borg_activate_item(act_disable_traps);
    if (_Var5) {
      borg_note("# Activation to Disable Traps, Destroy Doors");
      pbVar23->trap = false;
      borg.no_rest_prep = 3000;
      t.y = borg.goal.g.y;
      t.x = borg.goal.g.x;
      borg_target(t);
    }
    else if (((borg.trait[0x1f] << 2) / 5 < borg.trait[0x1e]) &&
            (_Var5 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS), _Var5)) {
      borg_note("# Disable Traps, Destroy Doors");
      pbVar23->trap = false;
      borg.no_rest_prep = 3000;
    }
    else {
      borg_note("# Disarming a trap");
      borg_keypress(0x44);
      borg_queue_direction(wVar8 + L'0');
      pbVar23->trap = false;
    }
  }
LAB_0020f4e9:
  uVar25 = 1;
LAB_0020f4ec:
  return SUB41(uVar25,0);
}

Assistant:

bool borg_flow_old(int why)
{
    int x, y;

    /* Continue */
    if (borg.goal.type == why) {
        int b_n = 0;

        int i, b_i = -1;

        int c, b_c;

        /* Flow cost of current grid */
        b_c = borg_data_flow->data[borg.c.y][borg.c.x] * 10;

        /* Prevent loops */
        b_c = b_c - 5;

        /* Look around */
        for (i = 0; i < 8; i++) {
            /* Grid in that direction */
            x = borg.c.x + ddx_ddd[i];
            y = borg.c.y + ddy_ddd[i];

            /* Flow cost at that grid */
            c = borg_data_flow->data[y][x] * 10;

            /* Never backtrack */
            if (c > b_c)
                continue;

            /* avoid screen edges */
            if (x > AUTO_MAX_X - 1 || x < 1 || y > AUTO_MAX_Y - 1 || y < 1)
                continue;

            /* Notice new best value */
            if (c < b_c)
                b_n = 0;

            /* Apply the randomizer to equivalent values */
            if (borg.trait[BI_CDEPTH] == 0 && (++b_n >= 2)
                && (randint0(b_n) != 0))
                continue;
            else if (borg.trait[BI_CDEPTH] >= 1 && ++b_n >= 2)
                continue;

            /* Special case when digging anti-summon corridor */
            if (borg.goal.type == GOAL_DIGGING
                && (ddx_ddd[i] == 0 || ddy_ddd[i] == 0)) {
                /* No straight lines */
                if (distance(borg.c, loc(borg_flow_x[0], borg_flow_y[0])) <= 2)
                    continue;
            }

            /* Track it */
            b_i = i;
            b_c = c;
        }

        /* Try it */
        if (b_i >= 0) {
            /* Access the location */
            x = borg.c.x + ddx_ddd[b_i];
            y = borg.c.y + ddy_ddd[b_i];

            /* Attempt motion */
            if (borg_play_step(y, x))
                return true;
        }

        /* Mark a timestamp to wait on a anti-summon spot for a few turns */
        if (borg.goal.type == GOAL_DIGGING && borg.c.y == borg_flow_y[0]
            && borg.c.x == borg_flow_x[0])
            borg_t_antisummon = borg_t;

        /* Cancel goal */
        borg.goal.type = 0;
    }

    /* Nothing to do */
    return false;
}